

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O2

void re2::CoalesceWalker::DoCoalesce(Regexp **r1ptr,Regexp **r2ptr)

{
  int *piVar1;
  Regexp *this;
  Regexp *this_00;
  int iVar2;
  Rune RVar3;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar4;
  Regexp *pRVar5;
  anon_struct_8_2_38aa0e4f_for_anon_union_16_7_2f55f9ff_for_Regexp_10_0 aVar6;
  ostream *poVar7;
  Regexp *this_01;
  Rune *pRVar8;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  LogMessageFatal local_1b0;
  
  this = *r1ptr;
  paVar9 = &this->field_5;
  paVar4 = paVar9;
  if (1 < this->nsub_) {
    paVar4 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
  }
  this_00 = *r2ptr;
  pRVar5 = Regexp::Incref(paVar4->subone_);
  pRVar5 = Regexp::Repeat(pRVar5,(uint)this->parse_flags_,0,0);
  switch(this->op_) {
  case '\a':
    aVar6.max_ = -1;
    aVar6.min_ = 0;
    goto LAB_0013cdd4;
  case '\b':
    aVar6.max_ = -1;
    aVar6.min_ = 1;
LAB_0013cdd4:
    (pRVar5->field_7).field_0 = aVar6;
    break;
  case '\t':
    *(int *)&pRVar5->field_7 = 1;
    *(int *)((long)&pRVar5->field_7 + 4) = 0;
    break;
  case '\n':
    iVar2 = Regexp::min(this);
    (pRVar5->field_7).field_0.min_ = iVar2;
    iVar2 = Regexp::max(this);
    (pRVar5->field_7).field_0.max_ = iVar2;
    break;
  default:
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x167);
    poVar7 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                             "DoCoalesce failed: r1->op() is ");
    std::ostream::operator<<(poVar7,(uint)this->op_);
    goto LAB_0013cfa9;
  }
  switch(this_00->op_) {
  case '\x03':
  case '\f':
  case '\r':
  case '\x14':
    piVar1 = &(pRVar5->field_7).field_0.min_;
    *piVar1 = *piVar1 + 1;
  case '\t':
    iVar2 = Regexp::max(pRVar5);
    if (iVar2 != -1) {
      (pRVar5->field_7).field_0.max_ = (pRVar5->field_7).field_0.max_ + 1;
    }
    break;
  case '\x04':
    if (1 < this->nsub_) {
      paVar9 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(this->field_5).submany_;
    }
    RVar3 = Regexp::rune(paVar9->subone_);
    lVar12 = -4;
    for (lVar11 = 1;
        (iVar2 = Regexp::nrunes(this_00), lVar11 < iVar2 &&
        (pRVar8 = Regexp::runes(this_00), pRVar8[lVar11] == RVar3)); lVar11 = lVar11 + 1) {
      lVar12 = lVar12 + -4;
    }
    piVar1 = &(pRVar5->field_7).field_0.min_;
    iVar10 = (int)lVar11;
    *piVar1 = *piVar1 + iVar10;
    iVar2 = Regexp::max(pRVar5);
    if (iVar2 != -1) {
      (pRVar5->field_7).field_0.max_ = (pRVar5->field_7).field_0.max_ + iVar10;
    }
    iVar2 = Regexp::nrunes(this_00);
    if (iVar2 != iVar10) {
      *r1ptr = pRVar5;
      pRVar8 = Regexp::runes(this_00);
      iVar2 = Regexp::nrunes(this_00);
      pRVar5 = Regexp::LiteralString
                         ((Rune *)((long)pRVar8 - lVar12),iVar2 - iVar10,(uint)this_00->parse_flags_
                         );
      goto LAB_0013ceaa;
    }
    break;
  default:
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
               0x1a4);
    poVar7 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                             "DoCoalesce failed: r2->op() is ");
    std::ostream::operator<<(poVar7,(uint)this_00->op_);
LAB_0013cfa9:
    LogMessageFatal::~LogMessageFatal(&local_1b0);
    Regexp::Decref(pRVar5);
    return;
  case '\b':
    piVar1 = &(pRVar5->field_7).field_0.min_;
    *piVar1 = *piVar1 + 1;
  case '\a':
switchD_0013ce00_caseD_7:
    (pRVar5->field_7).field_0.max_ = -1;
    break;
  case '\n':
    iVar2 = Regexp::min(this_00);
    piVar1 = &(pRVar5->field_7).field_0.min_;
    *piVar1 = *piVar1 + iVar2;
    iVar2 = Regexp::max(this_00);
    if (iVar2 == -1) goto switchD_0013ce00_caseD_7;
    iVar2 = Regexp::max(pRVar5);
    if (iVar2 != -1) {
      iVar2 = Regexp::max(this_00);
      (pRVar5->field_7).field_0.max_ = (pRVar5->field_7).field_0.max_ + iVar2;
    }
  }
  this_01 = (Regexp *)operator_new(0x28);
  Regexp::Regexp(this_01,kRegexpEmptyMatch,NoParseFlags);
  *r1ptr = this_01;
LAB_0013ceaa:
  *r2ptr = pRVar5;
  Regexp::Decref(this);
  Regexp::Decref(this_00);
  return;
}

Assistant:

void CoalesceWalker::DoCoalesce(Regexp** r1ptr, Regexp** r2ptr) {
  Regexp* r1 = *r1ptr;
  Regexp* r2 = *r2ptr;

  Regexp* nre = Regexp::Repeat(
      r1->sub()[0]->Incref(), r1->parse_flags(), 0, 0);

  switch (r1->op()) {
    case kRegexpStar:
      nre->min_ = 0;
      nre->max_ = -1;
      break;

    case kRegexpPlus:
      nre->min_ = 1;
      nre->max_ = -1;
      break;

    case kRegexpQuest:
      nre->min_ = 0;
      nre->max_ = 1;
      break;

    case kRegexpRepeat:
      nre->min_ = r1->min();
      nre->max_ = r1->max();
      break;

    default:
      LOG(DFATAL) << "DoCoalesce failed: r1->op() is " << r1->op();
      nre->Decref();
      return;
  }

  switch (r2->op()) {
    case kRegexpStar:
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpPlus:
      nre->min_++;
      nre->max_ = -1;
      goto LeaveEmpty;

    case kRegexpQuest:
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    case kRegexpRepeat:
      nre->min_ += r2->min();
      if (r2->max() == -1)
        nre->max_ = -1;
      else if (nre->max() != -1)
        nre->max_ += r2->max();
      goto LeaveEmpty;

    case kRegexpLiteral:
    case kRegexpCharClass:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
      nre->min_++;
      if (nre->max() != -1)
        nre->max_++;
      goto LeaveEmpty;

    LeaveEmpty:
      *r1ptr = new Regexp(kRegexpEmptyMatch, Regexp::NoParseFlags);
      *r2ptr = nre;
      break;

    case kRegexpLiteralString: {
      Rune r = r1->sub()[0]->rune();
      // Determine how much of the literal string is removed.
      // We know that we have at least one rune. :)
      int n = 1;
      while (n < r2->nrunes() && r2->runes()[n] == r)
        n++;
      nre->min_ += n;
      if (nre->max() != -1)
        nre->max_ += n;
      if (n == r2->nrunes())
        goto LeaveEmpty;
      *r1ptr = nre;
      *r2ptr = Regexp::LiteralString(
          &r2->runes()[n], r2->nrunes() - n, r2->parse_flags());
      break;
    }

    default:
      LOG(DFATAL) << "DoCoalesce failed: r2->op() is " << r2->op();
      nre->Decref();
      return;
  }

  r1->Decref();
  r2->Decref();
}